

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qeasingcurve.cpp
# Opt level: O2

QDebug operator<<(QDebug debug,QEasingCurve *item)

{
  long lVar1;
  QEasingCurvePrivate *pQVar2;
  QDebug *pQVar3;
  QString *pQVar4;
  storage_type *psVar5;
  long *in_RDX;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QByteArrayView ba_00;
  QByteArrayView ba_01;
  QArrayDataPointer<char16_t> local_d0;
  QArrayDataPointer<char16_t> local_b8;
  QArrayDataPointer<char16_t> local_a0;
  QArrayDataPointer<char16_t> local_88;
  QArrayDataPointer<char16_t> local_70;
  QArrayDataPointer<char16_t> local_58;
  QDebug local_40;
  QDebugStateSaver saver;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  saver.d._M_t.
  super___uniq_ptr_impl<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>._M_t
  .super__Tuple_impl<0UL,_QDebugStateSaverPrivate_*,_std::default_delete<QDebugStateSaverPrivate>_>.
  super__Head_base<0UL,_QDebugStateSaverPrivate_*,_false>._M_head_impl =
       (unique_ptr<QDebugStateSaverPrivate,_std::default_delete<QDebugStateSaverPrivate>_>)
       &DAT_aaaaaaaaaaaaaaaa;
  QDebugStateSaver::QDebugStateSaver(&saver,(QDebug *)item);
  pQVar3 = QDebug::operator<<((QDebug *)item,"type:");
  local_40.stream = pQVar3->stream;
  (local_40.stream)->ref = (local_40.stream)->ref + 1;
  operator<<((Stream *)&local_58,(Type)&local_40);
  pQVar3 = QDebug::operator<<((QDebug *)&local_58,"func:");
  psVar5 = (storage_type *)*in_RDX;
  QDebug::operator<<(pQVar3,*(void **)(psVar5 + 0x10));
  QDebug::~QDebug((QDebug *)&local_58);
  QDebug::~QDebug(&local_40);
  if (*(long *)(*in_RDX + 8) != 0) {
    pQVar4 = (QString *)QByteArrayView::lengthHelperCharArray("period:%1",10);
    ba.m_data = psVar5;
    ba.m_size = (qsizetype)"period:%1";
    QString::fromLatin1((QString *)&local_70,pQVar4,ba);
    psVar5 = (storage_type *)0x66;
    QString::arg_impl((QString *)&local_58,(QString *)&local_70,
                      *(double *)(*(long *)(*in_RDX + 8) + 0x10),0,'f',0x14,(QChar)0x20);
    pQVar3 = QDebug::operator<<((QDebug *)item,(QString *)&local_58);
    pQVar4 = (QString *)QByteArrayView::lengthHelperCharArray("amp:%1",7);
    ba_00.m_data = psVar5;
    ba_00.m_size = (qsizetype)"amp:%1";
    QString::fromLatin1((QString *)&local_a0,pQVar4,ba_00);
    psVar5 = (storage_type *)0x66;
    QString::arg_impl((QString *)&local_88,(QString *)&local_a0,
                      *(double *)(*(long *)(*in_RDX + 8) + 0x18),0,'f',0x14,(QChar)0x20);
    pQVar3 = QDebug::operator<<(pQVar3,(QString *)&local_88);
    pQVar4 = (QString *)QByteArrayView::lengthHelperCharArray("overshoot:%1",0xd);
    ba_01.m_data = psVar5;
    ba_01.m_size = (qsizetype)"overshoot:%1";
    QString::fromLatin1((QString *)&local_d0,pQVar4,ba_01);
    QString::arg_impl((QString *)&local_b8,(QString *)&local_d0,
                      *(double *)(*(long *)(*in_RDX + 8) + 0x20),0,'f',0x14,(QChar)0x20);
    QDebug::operator<<(pQVar3,(QString *)&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_b8);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_d0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_88);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_a0);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_58);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_70);
  }
  pQVar2 = item->d_ptr;
  item->d_ptr = (QEasingCurvePrivate *)0x0;
  ((debug.stream)->ts)._vptr_QTextStream = (_func_int **)pQVar2;
  QDebugStateSaver::~QDebugStateSaver(&saver);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (QDebug)debug.stream;
  }
  __stack_chk_fail();
}

Assistant:

QDebug operator<<(QDebug debug, const QEasingCurve &item)
{
    QDebugStateSaver saver(debug);
    debug << "type:" << item.d_ptr->type
          << "func:" << reinterpret_cast<const void *>(item.d_ptr->func);
    if (item.d_ptr->config) {
        debug << QString::fromLatin1("period:%1").arg(item.d_ptr->config->_p, 0, 'f', 20)
              << QString::fromLatin1("amp:%1").arg(item.d_ptr->config->_a, 0, 'f', 20)
              << QString::fromLatin1("overshoot:%1").arg(item.d_ptr->config->_o, 0, 'f', 20);
    }
    return debug;
}